

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

void ncnn::convolution_transform_kernel_packed_int8_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  size_t _elemsize;
  undefined1 (*pauVar14) [16];
  undefined8 *puVar15;
  undefined8 *puVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  uint _w;
  undefined1 (*pauVar23) [16];
  int iVar24;
  int k;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  __m128i _vindex;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [32];
  undefined1 in_ZMM4 [64];
  undefined1 in_ZMM5 [64];
  int local_14c;
  int local_148;
  int local_144;
  ulong uVar22;
  undefined1 auVar31 [32];
  
  _w = kernel_w * kernel_h;
  uVar22 = (ulong)_w;
  iVar9 = inch;
  if (outch < 8) {
    if (outch < 4) {
      if (outch < 2) {
        iVar6 = outch;
        if (7 < inch) {
          iVar9 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
          goto LAB_0025fcb5;
        }
        if (inch < 2) {
          _elemsize = 1;
          iVar13 = 1;
          goto LAB_0025fd93;
        }
        iVar9 = inch - ((uint)inch >> 1);
      }
      else {
        if (7 < inch) {
          iVar9 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
          iVar6 = (outch & 1U) + 1;
          goto LAB_0025fbeb;
        }
        if (1 < inch) {
          iVar9 = inch - ((uint)inch >> 1);
          iVar6 = (outch & 1U) + 1;
          goto LAB_0025fd18;
        }
        iVar6 = (outch & 1U) + 1;
      }
      _elemsize = 2;
      iVar13 = 2;
      goto LAB_0025fd93;
    }
    if (7 < inch) {
      _elemsize = 0x20;
      iVar13 = 0x20;
      iVar9 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
      iVar6 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
      goto LAB_0025fd93;
    }
    if (inch < 2) {
      iVar6 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
LAB_0025fd18:
      _elemsize = 4;
      iVar13 = 4;
      goto LAB_0025fd93;
    }
    iVar9 = inch - ((uint)inch >> 1);
    iVar6 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
  }
  else {
    if (7 < inch) {
      _elemsize = 0x40;
      iVar13 = 0x40;
      iVar9 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
      iVar6 = (outch & 1U) + ((uint)outch >> 3) + ((uint)outch >> 2 & 1) +
              (uint)(((uint)outch >> 1 & 1) != 0);
      goto LAB_0025fd93;
    }
    if (1 < inch) {
      iVar9 = inch - ((uint)inch >> 1);
      iVar6 = (outch & 1U) + ((uint)outch >> 3) + ((uint)outch >> 2 & 1) +
              (uint)(((uint)outch >> 1 & 1) != 0);
LAB_0025fbeb:
      _elemsize = 0x10;
      iVar13 = 0x10;
      goto LAB_0025fd93;
    }
    iVar6 = (outch & 1U) + ((uint)outch >> 3) + ((uint)outch >> 2 & 1) +
            (uint)(((uint)outch >> 1 & 1) != 0);
  }
LAB_0025fcb5:
  _elemsize = 8;
  iVar13 = 8;
LAB_0025fd93:
  Mat::create(kernel_tm,_w,iVar9,iVar6,_elemsize,iVar13,(Allocator *)0x0);
  uVar3 = 0;
  if (7 < outch) {
    local_14c = _w * inch;
    auVar28._4_4_ = local_14c;
    auVar28._0_4_ = local_14c;
    auVar28._8_4_ = local_14c;
    auVar28._12_4_ = local_14c;
    auVar38._16_4_ = local_14c;
    auVar38._0_16_ = auVar28;
    auVar38._20_4_ = local_14c;
    auVar38._24_4_ = local_14c;
    auVar38._28_4_ = local_14c;
    auVar28 = vpunpckldq_avx(auVar28,ZEXT416(local_14c + _w));
    auVar28 = vshufps_avx(ZEXT416(_w),auVar28,0x41);
    iVar13 = local_14c * 2;
    auVar26._4_4_ = iVar13;
    auVar26._0_4_ = iVar13;
    auVar26._8_4_ = iVar13;
    auVar26._12_4_ = iVar13;
    auVar28 = vpaddd_avx(auVar26,auVar28);
    auVar37 = ZEXT1664(auVar28);
    vpmulld_avx2(auVar38,_DAT_005f2f00);
    iVar21 = local_14c * 8;
    iVar9 = local_14c * 3;
    iVar10 = local_14c * 4;
    iVar6 = local_14c * 5;
    local_144 = local_14c * 6;
    local_148 = local_14c * 7;
    iVar8 = 0;
    auVar34._16_16_ = _DAT_005f3980;
    auVar34._0_16_ = _DAT_005f3980;
    in_ZMM2 = ZEXT3264(auVar34);
    uVar25 = 0;
    do {
      pvVar1 = kernel->data;
      pauVar14 = (undefined1 (*) [16])
                 ((uVar25 >> 3) * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
      if (inch < 8) {
        uVar5 = 0;
      }
      else {
        lVar20 = 0;
        iVar24 = 0;
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            lVar19 = lVar20;
            do {
              pauVar23 = pauVar14;
              lVar17 = 0;
              lVar18 = lVar19;
              do {
                lVar7 = lVar17;
                (*pauVar23)[lVar7] = *(undefined1 *)((long)pvVar1 + lVar18 + iVar8);
                (*pauVar23)[lVar7 + 1] =
                     *(undefined1 *)((long)pvVar1 + lVar18 + (long)iVar8 + (long)(int)_w);
                (*pauVar23)[lVar7 + 2] = *(undefined1 *)((long)pvVar1 + lVar18 + local_14c);
                (*pauVar23)[lVar7 + 3] =
                     *(undefined1 *)((long)pvVar1 + lVar18 + (long)local_14c + (long)(int)_w);
                (*pauVar23)[lVar7 + 4] = *(undefined1 *)((long)pvVar1 + lVar18 + iVar13);
                (*pauVar23)[lVar7 + 5] =
                     *(undefined1 *)((long)pvVar1 + lVar18 + (long)iVar13 + (long)(int)_w);
                (*pauVar23)[lVar7 + 6] = *(undefined1 *)((long)pvVar1 + lVar18 + iVar9);
                (*pauVar23)[lVar7 + 7] =
                     *(undefined1 *)((long)pvVar1 + lVar18 + (long)iVar9 + (long)(int)_w);
                (*pauVar23)[lVar7 + 8] = *(undefined1 *)((long)pvVar1 + lVar18 + iVar10);
                (*pauVar23)[lVar7 + 9] =
                     *(undefined1 *)((long)pvVar1 + lVar18 + (long)iVar10 + (long)(int)_w);
                (*pauVar23)[lVar7 + 10] = *(undefined1 *)((long)pvVar1 + lVar18 + iVar6);
                (*pauVar23)[lVar7 + 0xb] =
                     *(undefined1 *)((long)pvVar1 + lVar18 + (long)iVar6 + (long)(int)_w);
                (*pauVar23)[lVar7 + 0xc] = *(undefined1 *)((long)pvVar1 + lVar18 + local_144);
                (*pauVar23)[lVar7 + 0xd] =
                     *(undefined1 *)((long)pvVar1 + lVar18 + (long)local_144 + (long)(int)_w);
                (*pauVar23)[lVar7 + 0xe] = *(undefined1 *)((long)pvVar1 + lVar18 + local_148);
                (*pauVar23)[lVar7 + 0xf] =
                     *(undefined1 *)((long)pvVar1 + lVar18 + (long)local_148 + (long)(int)_w);
                lVar18 = lVar18 + (int)(_w * 2);
                lVar17 = lVar7 + 0x10;
              } while ((int)(lVar7 + 0x10) != 0x40);
              uVar3 = uVar3 + 1;
              lVar19 = lVar19 + 1;
              pauVar14 = (undefined1 (*) [16])(pauVar23[1] + lVar7);
            } while (uVar3 != uVar22);
            pauVar14 = (undefined1 (*) [16])(pauVar23[1] + lVar7);
          }
          iVar12 = iVar24 + 0xf;
          lVar20 = lVar20 + (int)(_w * 8);
          uVar5 = inch & 0xfffffff8;
          iVar24 = iVar24 + 8;
        } while (iVar12 < inch);
      }
      uVar2 = uVar5 | 1;
      while ((int)uVar2 < inch) {
        if (0 < (int)_w) {
          uVar3 = 0;
          do {
            auVar38 = vpcmpeqd_avx2(auVar37._0_32_,auVar37._0_32_);
            auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
            auVar35 = vpshufb_avx2(auVar38,auVar34);
            auVar38 = vpcmpeqd_avx2(auVar38,auVar38);
            auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
            auVar38 = vpshufb_avx2(auVar38,auVar34);
            auVar28 = vpunpckldq_avx(auVar35._0_16_,auVar35._16_16_);
            in_ZMM5 = ZEXT1664(auVar38._16_16_);
            auVar26 = vpunpckldq_avx(auVar38._0_16_,auVar38._16_16_);
            in_ZMM4 = ZEXT1664(auVar26);
            auVar28 = vpunpcklqdq_avx(auVar28,auVar26);
            auVar37 = ZEXT1664(auVar28);
            *pauVar14 = auVar28;
            pauVar14 = pauVar14 + 1;
            uVar3 = uVar3 + 1;
          } while (uVar22 != uVar3);
        }
        uVar2 = uVar5 + 3;
        uVar5 = uVar5 + 2;
      }
      if ((int)uVar5 < inch) {
        do {
          uVar3 = uVar22;
          if (0 < (int)_w) {
            do {
              auVar38 = vpcmpeqd_avx2(auVar37._0_32_,auVar37._0_32_);
              auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
              auVar38 = vpshufb_avx2(auVar38,auVar34);
              in_ZMM4 = ZEXT1664(auVar38._16_16_);
              auVar28 = vpunpckldq_avx(auVar38._0_16_,auVar38._16_16_);
              auVar37 = ZEXT1664(auVar28);
              *(long *)*pauVar14 = auVar28._0_8_;
              pauVar14 = (undefined1 (*) [16])(*pauVar14 + 8);
              uVar3 = uVar3 - 1;
            } while (uVar3 != 0);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != inch);
      }
      uVar3 = uVar25 + 8;
      uVar4 = uVar25 + 0xf;
      iVar8 = iVar8 + iVar21;
      local_14c = local_14c + iVar21;
      iVar13 = iVar13 + iVar21;
      iVar9 = iVar9 + iVar21;
      iVar10 = iVar10 + iVar21;
      iVar6 = iVar6 + iVar21;
      local_144 = local_144 + iVar21;
      local_148 = local_148 + iVar21;
      uVar25 = uVar3;
    } while (uVar4 < (uint)outch);
  }
  uVar5 = (uint)uVar3;
  if ((int)(uVar5 | 3) < outch) {
    iVar8 = _w * inch;
    auVar29._4_4_ = iVar8;
    auVar29._0_4_ = iVar8;
    auVar29._8_4_ = iVar8;
    auVar29._12_4_ = iVar8;
    auVar28 = vpunpckldq_avx(auVar29,ZEXT416(iVar8 + _w));
    auVar28 = vshufps_avx(ZEXT416(_w),auVar28,0x41);
    iVar9 = iVar8 * 2;
    auVar33._4_4_ = iVar9;
    auVar33._0_4_ = iVar9;
    auVar33._8_4_ = iVar9;
    auVar33._12_4_ = iVar9;
    vpaddd_avx(auVar33,auVar28);
    vpmulld_avx(auVar29,_DAT_005f14d0);
    iVar6 = (uVar5 | 3) * iVar8;
    iVar13 = iVar8 * 4;
    iVar10 = (uVar5 + 2) * iVar8;
    iVar9 = (uVar5 + 1) * iVar8;
    iVar8 = uVar5 * iVar8;
    auVar35._16_16_ = _DAT_005f3980;
    auVar35._0_16_ = _DAT_005f3980;
    in_ZMM2 = ZEXT3264(auVar35);
    uVar25 = uVar3 & 0xffffffff;
    do {
      pvVar1 = kernel->data;
      puVar15 = (undefined8 *)
                ((ulong)(((uint)(uVar25 >> 3) & 0x1fffffff) + (uint)(((uint)uVar25 >> 2 & 1) != 0))
                 * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
      if (inch < 8) {
        uVar5 = 0;
      }
      else {
        lVar20 = 0;
        iVar21 = 0;
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            lVar19 = lVar20;
            do {
              puVar16 = puVar15;
              lVar18 = 0;
              lVar17 = lVar19;
              do {
                *(undefined1 *)((long)puVar16 + lVar18) =
                     *(undefined1 *)((long)pvVar1 + lVar17 + iVar8);
                *(undefined1 *)((long)puVar16 + lVar18 + 1) =
                     *(undefined1 *)((long)pvVar1 + lVar17 + (long)iVar8 + (long)(int)_w);
                *(undefined1 *)((long)puVar16 + lVar18 + 2) =
                     *(undefined1 *)((long)pvVar1 + lVar17 + iVar9);
                *(undefined1 *)((long)puVar16 + lVar18 + 3) =
                     *(undefined1 *)((long)pvVar1 + lVar17 + (long)iVar9 + (long)(int)_w);
                *(undefined1 *)((long)puVar16 + lVar18 + 4) =
                     *(undefined1 *)((long)pvVar1 + lVar17 + iVar10);
                *(undefined1 *)((long)puVar16 + lVar18 + 5) =
                     *(undefined1 *)((long)pvVar1 + lVar17 + (long)iVar10 + (long)(int)_w);
                *(undefined1 *)((long)puVar16 + lVar18 + 6) =
                     *(undefined1 *)((long)pvVar1 + lVar17 + iVar6);
                *(undefined1 *)((long)puVar16 + lVar18 + 7) =
                     *(undefined1 *)((long)pvVar1 + lVar17 + (long)iVar6 + (long)(int)_w);
                lVar18 = lVar18 + 8;
                lVar17 = lVar17 + (int)(_w * 2);
              } while ((int)lVar18 != 0x20);
              uVar3 = uVar3 + 1;
              lVar19 = lVar19 + 1;
              puVar15 = (undefined8 *)((long)puVar16 + lVar18);
            } while (uVar3 != uVar22);
            puVar15 = (undefined8 *)((long)puVar16 + lVar18);
          }
          iVar24 = iVar21 + 0xf;
          lVar20 = lVar20 + (int)(_w * 8);
          uVar5 = inch & 0xfffffff8;
          iVar21 = iVar21 + 8;
        } while (iVar24 < inch);
      }
      uVar2 = uVar5 | 1;
      while ((int)uVar2 < inch) {
        if (0 < (int)_w) {
          uVar3 = 0;
          do {
            auVar38 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
            auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
            auVar38 = vpshufb_avx2(auVar38,auVar35);
            in_ZMM5 = ZEXT1664(auVar38._16_16_);
            auVar28 = vpunpckldq_avx(auVar38._0_16_,auVar38._16_16_);
            in_ZMM4 = ZEXT1664(auVar28);
            *puVar15 = auVar28._0_8_;
            puVar15 = puVar15 + 1;
            uVar3 = uVar3 + 1;
          } while (uVar22 != uVar3);
        }
        uVar2 = uVar5 + 3;
        uVar5 = uVar5 + 2;
      }
      if ((int)uVar5 < inch) {
        do {
          uVar3 = uVar22;
          if (0 < (int)_w) {
            do {
              auVar28 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
              auVar28 = vpgatherdd((undefined1  [16])0x0,auVar28);
              in_ZMM5 = ZEXT1664((undefined1  [16])0x0);
              auVar28 = vpshufb_avx(auVar28,SUB6416(ZEXT464(0xc080400),0));
              in_ZMM4 = ZEXT1664(auVar28);
              *(int *)puVar15 = auVar28._0_4_;
              puVar15 = (undefined8 *)((long)puVar15 + 4);
              uVar3 = uVar3 - 1;
            } while (uVar3 != 0);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != inch);
      }
      uVar3 = uVar25 + 4;
      lVar20 = uVar25 + 7;
      iVar6 = iVar6 + iVar13;
      iVar10 = iVar10 + iVar13;
      iVar9 = iVar9 + iVar13;
      iVar8 = iVar8 + iVar13;
      uVar25 = uVar3;
    } while (lVar20 < outch);
    uVar3 = uVar3 & 0xffffffff;
  }
  uVar5 = (uint)uVar3 | 1;
  if ((int)uVar5 < outch) {
    uVar2 = _w * inch;
    auVar30._4_4_ = _w;
    auVar30._0_4_ = _w;
    auVar30._8_4_ = _w;
    auVar30._12_4_ = _w;
    auVar31._16_4_ = _w;
    auVar31._0_16_ = auVar30;
    auVar31._20_4_ = _w;
    auVar31._24_4_ = _w;
    auVar31._28_4_ = _w;
    vpmulld_avx2(auVar31,_DAT_005f2f00);
    auVar28 = vpunpckldq_avx(auVar30,ZEXT416(uVar2 + _w));
    vshufps_avx(ZEXT416(uVar2),auVar28,0x41);
    auVar36._16_16_ = _DAT_005f3980;
    auVar36._0_16_ = _DAT_005f3980;
    in_ZMM2 = ZEXT3264(auVar36);
    uVar25 = uVar3 & 0xffffffff;
    do {
      lVar20 = (long)(int)(uVar2 * (uint)uVar25) + (long)kernel->data;
      lVar19 = (long)(int)(uVar5 * uVar2) + (long)kernel->data;
      pauVar14 = (undefined1 (*) [16])
                 (kernel_tm->elemsize * kernel_tm->cstep *
                  (ulong)(((uint)(uVar25 >> 2) & 1) + ((uint)(uVar25 >> 3) & 0x1fffffff) +
                         (uint)(((uint)uVar25 >> 1 & 1) != 0)) + (long)kernel_tm->data);
      uVar11 = 0;
      uVar5 = 0;
      if (7 < inch) {
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            do {
              auVar38 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
              auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
              auVar34 = vpshufb_avx2(auVar38,auVar36);
              auVar38 = vpcmpeqd_avx2(auVar38,auVar38);
              auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
              auVar38 = vpshufb_avx2(auVar38,auVar36);
              auVar28 = vpunpckldq_avx(auVar34._0_16_,auVar34._16_16_);
              auVar26 = vpunpckldq_avx(auVar38._0_16_,auVar38._16_16_);
              auVar28 = vpunpcklqdq_avx(auVar28,auVar26);
              in_ZMM4 = ZEXT1664(auVar28);
              *pauVar14 = auVar28;
              pauVar14 = pauVar14 + 1;
              uVar3 = uVar3 + 1;
            } while (uVar22 != uVar3);
          }
          lVar20 = lVar20 + (int)(_w * 8);
          lVar19 = lVar19 + (int)(_w * 8);
          iVar9 = uVar11 + 0xf;
          uVar11 = uVar11 + 8;
          uVar5 = inch & 0xfffffff8;
        } while (iVar9 < inch);
      }
      uVar11 = uVar5 | 1;
      while ((int)uVar11 < inch) {
        if (0 < (int)_w) {
          uVar3 = 0;
          do {
            auVar28 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
            auVar28 = vpgatherdd((undefined1  [16])0x0,auVar28);
            auVar28 = vpshufb_avx(auVar28,SUB6416(ZEXT464(0xc080400),0));
            in_ZMM4 = ZEXT1664(auVar28);
            *(int *)*pauVar14 = auVar28._0_4_;
            pauVar14 = (undefined1 (*) [16])(*pauVar14 + 4);
            uVar3 = uVar3 + 1;
          } while (uVar22 != uVar3);
        }
        lVar20 = lVar20 + (int)(_w * 2);
        lVar19 = lVar19 + (int)(_w * 2);
        uVar11 = uVar5 + 3;
        uVar5 = uVar5 + 2;
      }
      if ((int)uVar5 < inch) {
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            do {
              (*pauVar14)[0] = *(undefined1 *)(lVar20 + uVar3);
              (*pauVar14)[1] = *(undefined1 *)(lVar19 + uVar3);
              pauVar14 = (undefined1 (*) [16])(*pauVar14 + 2);
              uVar3 = uVar3 + 1;
            } while (uVar22 != uVar3);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != inch);
      }
      uVar3 = uVar25 + 2;
      lVar20 = uVar25 + 3;
      uVar5 = (uint)lVar20;
      uVar25 = uVar3;
    } while (lVar20 < outch);
  }
  if ((int)uVar3 < outch) {
    auVar27._4_4_ = _w;
    auVar27._0_4_ = _w;
    auVar27._8_4_ = _w;
    auVar27._12_4_ = _w;
    auVar27._16_4_ = _w;
    auVar27._20_4_ = _w;
    auVar27._24_4_ = _w;
    auVar27._28_4_ = _w;
    vpmulld_avx2(auVar27,_DAT_005f2f00);
    uVar3 = (ulong)(int)uVar3;
    auVar32._16_16_ = _DAT_005f3980;
    auVar32._0_16_ = _DAT_005f3980;
    do {
      uVar5 = (uint)uVar3;
      lVar20 = (long)(int)(_w * inch * uVar5) + (long)kernel->data;
      puVar15 = (undefined8 *)
                (kernel_tm->elemsize * kernel_tm->cstep *
                 (ulong)((uVar5 & 1) + ((uint)(uVar3 >> 3) & 0x1fffffff) + ((uint)(uVar3 >> 2) & 1)
                        + (uint)((uVar5 >> 1 & 1) != 0)) + (long)kernel_tm->data);
      uVar5 = 0;
      uVar2 = 0;
      if (7 < inch) {
        do {
          if (0 < (int)_w) {
            uVar25 = 0;
            do {
              auVar38 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
              auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
              auVar38 = vpshufb_avx2(auVar38,auVar32);
              auVar28 = vpunpckldq_avx(auVar38._0_16_,auVar38._16_16_);
              in_ZMM2 = ZEXT1664(auVar28);
              *puVar15 = auVar28._0_8_;
              puVar15 = puVar15 + 1;
              uVar25 = uVar25 + 1;
            } while (uVar22 != uVar25);
          }
          lVar20 = lVar20 + (int)(_w * 8);
          iVar9 = uVar5 + 0xf;
          uVar5 = uVar5 + 8;
          uVar2 = inch & 0xfffffff8;
        } while (iVar9 < inch);
      }
      if ((int)(uVar2 | 1) < inch) {
        lVar19 = lVar20 + (int)_w;
        uVar5 = uVar2;
        do {
          if (0 < (int)_w) {
            uVar25 = 0;
            do {
              *(undefined1 *)puVar15 = *(undefined1 *)(lVar20 + uVar25);
              *(undefined1 *)((long)puVar15 + 1) = *(undefined1 *)(lVar19 + uVar25);
              puVar15 = (undefined8 *)((long)puVar15 + 2);
              uVar25 = uVar25 + 1;
            } while (uVar22 != uVar25);
          }
          lVar20 = lVar20 + (int)(_w * 2);
          uVar2 = uVar5 + 2;
          iVar9 = uVar5 + 3;
          lVar19 = lVar19 + (int)(_w * 2);
          uVar5 = uVar2;
        } while (iVar9 < inch);
      }
      if ((int)uVar2 < inch) {
        do {
          if (0 < (int)_w) {
            uVar25 = 0;
            do {
              *(undefined1 *)((long)puVar15 + uVar25) = *(undefined1 *)(lVar20 + uVar25);
              uVar25 = uVar25 + 1;
            } while (uVar22 != uVar25);
            puVar15 = (undefined8 *)((long)puVar15 + uVar25);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != inch);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (long)outch);
  }
  return;
}

Assistant:

void convolution_transform_kernel_packed_int8_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    convolution_transform_kernel_packed_int8(kernel, kernel_tm, inch, outch, kernel_w, kernel_h);
}